

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O3

REF_STATUS ref_geom_uv_area_sign(REF_GRID ref_grid,REF_INT id,REF_DBL *sign)

{
  double *pdVar1;
  REF_GEOM ref_geom;
  REF_CELL ref_cell;
  REF_STATUS RVar2;
  uint uVar3;
  REF_DBL *pRVar4;
  ulong uVar5;
  undefined8 uVar6;
  long lVar7;
  char *pcVar8;
  int cell;
  REF_DBL uv_area;
  REF_INT nodes [27];
  double local_b0;
  REF_INT local_a8 [3];
  int local_9c;
  
  ref_geom = ref_grid->geom;
  if (ref_geom->uv_area_sign == (REF_DBL *)0x0) {
    ref_cell = ref_grid->cell[3];
    uVar3 = ref_geom->nface;
    if (uVar3 == 0xffffffff) {
      uVar3 = ref_geom_infer_nedge_nface(ref_grid);
      if (uVar3 != 0) {
        pcVar8 = "infer counts";
        uVar6 = 0x117;
LAB_0012505a:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               uVar6,"ref_geom_uv_area_sign",(ulong)uVar3,pcVar8);
        return uVar3;
      }
      uVar3 = ref_geom->nface;
    }
    if ((int)uVar3 < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x118,
             "ref_geom_uv_area_sign","malloc ref_geom->uv_area_sign of REF_DBL negative");
      return 1;
    }
    pRVar4 = (REF_DBL *)malloc((ulong)uVar3 << 3);
    ref_geom->uv_area_sign = pRVar4;
    if (pRVar4 == (REF_DBL *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x118,
             "ref_geom_uv_area_sign","malloc ref_geom->uv_area_sign of REF_DBL NULL");
      return 2;
    }
    if (uVar3 != 0) {
      memset(pRVar4,0,(ulong)uVar3 << 3);
    }
    if (0 < ref_cell->max) {
      cell = 0;
      do {
        RVar2 = ref_cell_nodes(ref_cell,cell,local_a8);
        if (((RVar2 == 0) && (lVar7 = (long)local_9c, 0 < lVar7)) && (local_9c <= ref_geom->nface))
        {
          uVar3 = ref_geom_uv_area(ref_geom,local_a8,&local_b0);
          if (uVar3 != 0) {
            pcVar8 = "uv area";
            uVar6 = 0x11c;
            goto LAB_0012505a;
          }
          ref_geom->uv_area_sign[lVar7 + -1] =
               ref_geom->uv_area_sign[lVar7 + -1] +
               *(double *)((ulong)(local_b0 < 0.0) * 8 + 0x1ffff0);
        }
        cell = cell + 1;
      } while (cell < ref_cell->max);
      uVar3 = ref_geom->nface;
    }
    if (0 < (int)uVar3) {
      pRVar4 = ref_geom->uv_area_sign;
      uVar5 = 0;
      do {
        pdVar1 = pRVar4 + uVar5;
        pRVar4[uVar5] = *(REF_DBL *)((ulong)(*pdVar1 <= 0.0 && *pdVar1 != 0.0) * 8 + 0x1ffff0);
        uVar5 = uVar5 + 1;
      } while (uVar3 != uVar5);
    }
  }
  RVar2 = 3;
  if ((0 < id) && (id <= ref_geom->nface)) {
    *sign = ref_geom->uv_area_sign[(ulong)(uint)id - 1];
    RVar2 = 0;
  }
  return RVar2;
}

Assistant:

REF_FCN REF_STATUS ref_geom_uv_area_sign(REF_GRID ref_grid, REF_INT id,
                                         REF_DBL *sign) {
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  if (NULL == ((ref_geom)->uv_area_sign)) {
    REF_CELL ref_cell = ref_grid_tri(ref_grid);
    REF_INT face;
    REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
    REF_DBL uv_area;
    if (REF_EMPTY == ref_geom->nface)
      RSS(ref_geom_infer_nedge_nface(ref_grid), "infer counts");
    ref_malloc_init(ref_geom->uv_area_sign, ref_geom->nface, REF_DBL, 0.0);
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      face = nodes[3];
      if (face < 1 || ref_geom->nface < face) continue;
      RSS(ref_geom_uv_area(ref_geom, nodes, &uv_area), "uv area");
      if (uv_area < 0.0) {
        ((ref_geom)->uv_area_sign)[face - 1] -= 1.0;
      } else {
        ((ref_geom)->uv_area_sign)[face - 1] += 1.0;
      }
    }
    for (face = 0; face < ref_geom->nface; face++) {
      if (((ref_geom)->uv_area_sign)[face] < 0.0) {
        ((ref_geom)->uv_area_sign)[face] = -1.0;
      } else {
        ((ref_geom)->uv_area_sign)[face] = 1.0;
      }
    }
  }

  if (id < 1 || id > ref_geom->nface) return REF_INVALID;
  *sign = ((ref_geom)->uv_area_sign)[id - 1];

  return REF_SUCCESS;
}